

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

string * __thiscall
kratos::Generator::get_unique_variable_name
          (string *__return_storage_ptr__,Generator *this,string *prefix,string *var_name)

{
  undefined8 uVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  int iVar2;
  basic_string_view<char> bVar3;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  string local_a0;
  string *local_80;
  undefined1 local_78 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_40._M_allocated_capacity = (size_type)this;
  local_40._8_8_ = var_name;
  if ((pointer)prefix->_M_string_length == (pointer)0x0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else {
    local_78._0_8_ = (prefix->_M_dataplus)._M_p;
    local_78._16_8_ = (var_name->_M_dataplus)._M_p;
    local_78._24_8_ = var_name->_M_string_length;
    local_78._8_8_ = (pointer)prefix->_M_string_length;
    bVar3 = fmt::v7::to_string_view<char,_0>("{0}_{1}");
    format_str.data_ = (char *)bVar3.size_;
    format_str.size_ = 0xdd;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_78;
    fmt::v7::detail::vformat_abi_cxx11_(&local_a0,(detail *)bVar3.data_,format_str,args);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  local_80 = prefix;
  get_var((Generator *)local_78,(string *)local_40._M_allocated_capacity);
  uVar1 = local_78._0_8_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  if ((_func_int **)uVar1 != (_func_int **)0x0) {
    local_78._16_8_ = (pointer)0x0;
    do {
      local_78._8_8_ = local_80->_M_string_length;
      iVar2 = (int)local_78._16_8_;
      if ((pointer)local_78._8_8_ == (pointer)0x0) {
        local_78._0_8_ = *(undefined8 *)local_40._8_8_;
        local_78._8_8_ = *(size_type *)(local_40._8_8_ + 8);
        bVar3 = fmt::v7::to_string_view<char,_0>("{0}_{1}");
        format_str_01.data_ = (char *)bVar3.size_;
        format_str_01.size_ = 0x2d;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_78;
        fmt::v7::detail::vformat_abi_cxx11_(&local_a0,(detail *)bVar3.data_,format_str_01,args_01);
      }
      else {
        local_78._0_8_ = (local_80->_M_dataplus)._M_p;
        local_78._24_8_ = *(size_type *)(local_40._8_8_ + 8);
        local_78._32_8_ = local_78._16_8_;
        local_78._16_8_ = *(pointer *)local_40._8_8_;
        bVar3 = fmt::v7::to_string_view<char,_0>("{0}_{1}_{2}");
        format_str_00.data_ = (char *)bVar3.size_;
        format_str_00.size_ = 0x2dd;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_78;
        fmt::v7::detail::vformat_abi_cxx11_(&local_a0,(detail *)bVar3.data_,format_str_00,args_00);
      }
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      get_var((Generator *)local_78,(string *)local_40._M_allocated_capacity);
      uVar1 = local_78._0_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
      local_78._16_8_ = ZEXT48(iVar2 + 1);
    } while ((_func_int **)uVar1 != (_func_int **)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::get_unique_variable_name(const std::string &prefix,
                                                const std::string &var_name) {
    // NOTE: this is not thread-safe!
    uint32_t count = 0;
    std::string result_name;
    // maybe we're lucky and not need to prefix the count
    if (prefix.empty()) {
        result_name = var_name;
    } else {
        result_name = ::format("{0}_{1}", prefix, var_name);
    }
    if (!get_var(result_name)) return result_name;

    while (true) {
        if (prefix.empty()) {
            result_name = ::format("{0}_{1}", var_name, count);
        } else {
            result_name = ::format("{0}_{1}_{2}", prefix, var_name, count);
        }
        if (!get_var(result_name)) {
            break;
        } else {
            count++;
        }
    }
    return result_name;
}